

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int act_mod_hdrs(nt_opts *opts)

{
  char *data;
  int iVar1;
  nifti_1_header *h;
  nifti_image *nim;
  size_t sVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  int swap;
  char func [13];
  int local_54;
  str_list *local_50;
  char *local_48;
  undefined5 local_40;
  undefined3 local_3b;
  undefined5 uStack_38;
  
  uStack_38 = 0x73726468;
  local_40 = 0x6d5f746361;
  local_3b = 0x5f646f;
  if (2 < g_debug) {
    act_mod_hdrs_cold_1();
  }
  if ((0 < (opts->flist).len) && (0 < (opts->infiles).len)) {
    local_50 = &opts->flist;
    local_48 = opts->command;
    lVar5 = 0;
    do {
      pcVar3 = (opts->infiles).list[lVar5];
      iVar1 = nifti_is_gzfile(pcVar3);
      if (iVar1 == 0) {
        h = nt_read_header(opts,pcVar3,&local_54,0);
        if (h == (nifti_1_header *)0x0) {
          return 1;
        }
        if (1 < g_debug) {
          act_mod_hdrs_cold_2();
        }
        iVar1 = modify_all_fields(h,opts,g_hdr_fields,0x2b);
        if (iVar1 != 0) {
          free(h);
          return 1;
        }
        if (opts->prefix == (char *)0x0) {
          if (local_54 != 0) {
            uVar4 = 0;
            if ((((h->magic[0] == 'n') && (uVar4 = 0, h->magic[3] == '\0')) &&
                ((uVar4 = 0, h->magic[1] == 'i' || (h->magic[1] == '+')))) &&
               ((byte)(h->magic[2] - 0x31U) < 9)) {
              uVar4 = (uint)(byte)(h->magic[2] - 0x30);
            }
            swap_nifti_header(h,uVar4);
          }
          write_hdr_to_file(h,pcVar3);
        }
        else {
          nim = nt_image_read(opts,pcVar3,1);
          data = local_48;
          if (nim == (nifti_image *)0x0) {
            fprintf(_stderr,"** failed to dup file \'%s\' before modifying\n",pcVar3);
            return 1;
          }
          if (opts->keep_hist != 0) {
            sVar2 = strlen(local_48);
            iVar1 = nifti_add_extension(nim,data,(int)sVar2,6);
            if (iVar1 != 0) {
              act_mod_hdrs_cold_3();
            }
          }
          iVar1 = nifti_set_filenames(nim,opts->prefix,1,1);
          if (iVar1 != 0) {
            fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",&local_40,
                    "failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
          }
          pcVar3 = nifti_strdup(nim->fname);
          nifti_image_write(nim);
          if (0x15b < nim->iname_offset) {
            h->vox_offset = (float)nim->iname_offset;
          }
          nifti_image_free(nim);
          write_hdr_to_file(h,pcVar3);
          if (pcVar3 != (char *)0x0) {
            free(pcVar3);
          }
        }
        free(h);
      }
      else {
        fprintf(_stderr,"** sorry, cannot modify a gzipped file: %s\n",pcVar3);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (opts->infiles).len);
  }
  return 0;
}

Assistant:

int act_mod_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr;
   nifti_image    * nim;         /* for reading/writing entire datasets */
   int              filec, swap;
   char           * fname, * dupname;
   char             func[] = { "act_mod_hdrs" };

   if( g_debug > 2 )
      fprintf(stderr,"-d modifying %d fields for %d nifti headers...\n",
              opts->flist.len, opts->infiles.len);
   if( opts->flist.len <= 0 || opts->infiles.len <= 0 ) return 0;

   for( filec = 0; filec < opts->infiles.len; filec++ )
   {
      fname = opts->infiles.list[filec];  /* for convenience and mod file */

      if( nifti_is_gzfile(fname) ){
         fprintf(stderr,"** sorry, cannot modify a gzipped file: %s\n", fname);
         continue;
      }

      /* do not validate the header structure */
      nhdr = nt_read_header(opts, fname, &swap, 0);
      if( !nhdr ) return 1;

      if( g_debug > 1 )
      {
         fprintf(stderr,"-d modifying %d fields of '%s' header\n",
                 opts->flist.len, fname);
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");
      }

      /* okay, let's actually trash the data fields */
      if( modify_all_fields(nhdr, opts, g_hdr_fields, NT_HDR_NUM_FIELDS) )
      {
         free(nhdr);
         return 1;
      }

      dupname = NULL;                     /* unless we duplicate file   */

      /* possibly duplicate the current dataset before writing new header */
      if( opts->prefix )
      {
         nim = nt_image_read(opts, fname, 1); /* get data */
         if( !nim ) {
            fprintf(stderr,"** failed to dup file '%s' before modifying\n",
                    fname);
            return 1;
         }
         if( opts->keep_hist && nifti_add_extension(nim, opts->command,
                                strlen(opts->command), NIFTI_ECODE_COMMENT) )
               fprintf(stderr,"** failed to add command to image as exten\n");
         if( nifti_set_filenames(nim, opts->prefix, 1, 1) )
         {
            NTL_FERR(func,"failed to set prefix for new file: ",opts->prefix);
            nifti_image_free(nim);
            return 1;
         }
         dupname = nifti_strdup(nim->fname);  /* so we know to free it */
         fname = dupname;
         nifti_image_write(nim);  /* create the duplicate file */
         /* if we added a history note, get the new offset into the header */
         /* mod: if the new offset is valid, use it    31 Jan 2006 [rickr] */
         if( nim->iname_offset >= 348 ) nhdr->vox_offset = nim->iname_offset;
         nifti_image_free(nim);
      }
      else if ( swap )
         swap_nifti_header(nhdr, NIFTI_VERSION(*nhdr));

      /* if all is well, overwrite header in fname dataset */
      (void)write_hdr_to_file(nhdr, fname); /* errors printed in function */

      if( dupname ) free(dupname);
      free(nhdr);
   }

   return 0;
}